

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

double BitsEntropyRefine(VP8LBitEntropy *entropy)

{
  double dVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = entropy->nonzeros;
  if (iVar2 < 5) {
    if (iVar2 < 2) {
      return 0.0;
    }
    if (iVar2 == 3) {
      dVar3 = 0.95;
    }
    else {
      if (iVar2 == 2) {
        return (double)entropy->sum * 0.99 + entropy->entropy * 0.01;
      }
      dVar3 = 0.7;
    }
  }
  else {
    dVar3 = 0.627;
  }
  dVar1 = entropy->entropy;
  dVar3 = (double)(entropy->sum * 2 - entropy->max_val) * dVar3 + (1.0 - dVar3) * dVar1;
  if (dVar3 <= dVar1) {
    dVar3 = dVar1;
  }
  return dVar3;
}

Assistant:

static WEBP_INLINE double BitsEntropyRefine(const VP8LBitEntropy* entropy) {
  double mix;
  if (entropy->nonzeros < 5) {
    if (entropy->nonzeros <= 1) {
      return 0;
    }
    // Two symbols, they will be 0 and 1 in a Huffman code.
    // Let's mix in a bit of entropy to favor good clustering when
    // distributions of these are combined.
    if (entropy->nonzeros == 2) {
      return 0.99 * entropy->sum + 0.01 * entropy->entropy;
    }
    // No matter what the entropy says, we cannot be better than min_limit
    // with Huffman coding. I am mixing a bit of entropy into the
    // min_limit since it produces much better (~0.5 %) compression results
    // perhaps because of better entropy clustering.
    if (entropy->nonzeros == 3) {
      mix = 0.95;
    } else {
      mix = 0.7;  // nonzeros == 4.
    }
  } else {
    mix = 0.627;
  }

  {
    double min_limit = 2 * entropy->sum - entropy->max_val;
    min_limit = mix * min_limit + (1.0 - mix) * entropy->entropy;
    return (entropy->entropy < min_limit) ? min_limit : entropy->entropy;
  }
}